

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_ManSetupVars(Zyx_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  int iVar6;
  ulong uVar7;
  
  if (p->pPars->fMajority == 0) {
    pwVar5 = p->pTruth;
  }
  else {
    uVar2 = p->nWords * p->nObjs;
    if (((int)uVar2 < 0) || (p->vInfo->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pwVar5 = p->vInfo->pArray + uVar2;
  }
  for (iVar3 = p->pPars->nVars; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
    Zyx_SetConstVar(p,(iVar3 - p->pPars->nVars) * (p->LutMask + 1),0);
  }
  for (iVar3 = p->pPars->nVars; iVar1 = p->nObjs, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    iVar1 = p->nObjs;
    iVar6 = iVar3;
    if (iVar3 < iVar1) {
      do {
        Zyx_SetConstVar(p,(iVar3 - p->pPars->nVars) * iVar1 + p->TopoBase + iVar6,0);
        iVar6 = iVar6 + 1;
        iVar1 = p->nObjs;
      } while (iVar6 < iVar1);
    }
  }
  Zyx_SetConstVar(p,(~p->pPars->nVars + iVar1) * iVar1 + p->TopoBase + iVar1 + -2,1);
  if ((p->pPars->fMajority != 0) && (0 < p->pPars->nVars)) {
    uVar2 = 0;
    do {
      Zyx_SetConstVar(p,p->TopoBase + uVar2,(uint)(uVar2 < 3));
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < p->pPars->nVars);
  }
  if (p->pPars->nVars != 0x1f) {
    uVar7 = 0;
    do {
      uVar2 = (uint)uVar7;
      if (0 < p->pPars->nVars) {
        uVar4 = 0;
        do {
          Zyx_SetConstVar(p,p->nObjs * uVar2 + p->MintBase + uVar4,
                          (uint)((uVar2 >> (uVar4 & 0x1f) & 1) != 0));
          uVar4 = uVar4 + 1;
        } while ((int)uVar4 < p->pPars->nVars);
      }
      Zyx_SetConstVar(p,p->nObjs * uVar2 + p->MintBase + p->nObjs + -1,
                      (uint)((pwVar5[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0));
      uVar7 = (ulong)(uVar2 + 1);
    } while ((int)(uVar2 + 1) < 1 << ((byte)p->pPars->nVars & 0x1f));
  }
  return;
}

Assistant:

void Zyx_ManSetupVars( Zyx_Man_t * p )
{
    int i, k, m;
    word * pSpec = p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : p->pTruth;
    // set unused functionality vars to 0
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        Zyx_SetConstVar( p, Zyx_FuncVar(p, i, 0), 0 );
    // set unused topology vars
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( k = i; k < p->nObjs; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, i, k), 0 );
    // connect topmost node
    Zyx_SetConstVar( p, Zyx_TopoVar(p, p->nObjs-1, p->nObjs-2), 1 );
    // connect first node
    if ( p->pPars->fMajority )
        for ( k = 0; k < p->pPars->nVars; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, p->pPars->nVars, k), k < 3 );
    // set minterm vars
    for ( m = 0; m < (1 << p->pPars->nVars); m++ )
    {
        for ( i = 0; i < p->pPars->nVars; i++ )
            Zyx_SetConstVar( p, Zyx_MintVar(p, m, i), (m >> i) & 1 );
        Zyx_SetConstVar( p, Zyx_MintVar(p, m, p->nObjs-1), Abc_TtGetBit(pSpec, m) );
    }
}